

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.cpp
# Opt level: O3

void read_pub_files<ENF>(ENF *pub,string *filename,bool auto_split)

{
  pointer pPVar1;
  pointer pEVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  FILE *__stream;
  size_t sVar7;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uint uVar9;
  char header_buf [10];
  string filename_template;
  char fn_buf [256];
  undefined1 local_1aa [3];
  undefined4 local_1a7;
  undefined2 local_1a3;
  uchar local_1a1;
  undefined8 local_1a0;
  vector<Pub_File,_std::allocator<Pub_File>_> *local_198;
  string local_190;
  Pub_File local_170;
  char local_138 [264];
  
  local_198 = &pub->files;
  std::vector<Pub_File,_std::allocator<Pub_File>_>::_M_erase_at_end
            (local_198,
             (pub->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::_M_erase_at_end
            (&pub->data,
             (pub->data).
             super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>._M_impl.
             super__Vector_impl_data._M_start);
  convert_pub_filename(&local_190,filename);
  snprintf(local_138,0x100,local_190._M_dataplus._M_p,1);
  __stream = fopen(local_138,"rb");
  eodata_safe_fail_filename = (filename->_M_dataplus)._M_p;
  if (__stream == (FILE *)0x0) {
    Console::Err("Could not load file: %s");
  }
  else {
    sVar7 = fread(local_1aa,1,10,__stream);
    if (sVar7 == 10) {
      *(undefined4 *)(pub->rid)._M_elems = local_1a7;
      *(undefined2 *)(pub->len)._M_elems = local_1a3;
      uVar4 = PacketProcessor::Number((uchar)local_1a3,(uchar)((ushort)local_1a3 >> 8),0xfe,0xfe);
      local_1a0 = CONCAT44(extraout_var,uVar4);
      uVar4 = PacketProcessor::Number(local_1a1,0xfe,0xfe,0xfe);
      std::vector<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>::resize
                (&pub->data,(long)((int)local_1a0 + 1));
      paVar8 = &local_170.filename.field_2;
      uVar9 = 1;
      iVar6 = 0;
      do {
        if (((int)local_1a0 <= iVar6) || (999 < uVar9)) break;
        snprintf(local_138,0x100,local_190._M_dataplus._M_p,(ulong)uVar9);
        local_170.filename._M_dataplus._M_p = (pointer)paVar8;
        sVar7 = strlen(local_138);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_170,local_138,local_138 + sVar7);
        local_170.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_170.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_170.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Pub_File,_std::allocator<Pub_File>_>::emplace_back<Pub_File>
                  (local_198,&local_170);
        if (local_170.splits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.splits.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.splits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.splits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170.filename._M_dataplus._M_p != paVar8) {
          operator_delete(local_170.filename._M_dataplus._M_p,
                          local_170.filename.field_2._M_allocated_capacity + 1);
        }
        pPVar1 = (pub->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar5 = read_single_file<ENF>(pub,pPVar1 + -1,auto_split,uVar4,iVar6 + 1);
        iVar6 = iVar5 + iVar6;
        uVar9 = uVar9 + 1;
      } while ((ulong)((long)pPVar1[-1].splits.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)pPVar1[-1].splits.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start) < 0x11);
      if ((int)uVar4 < 1) {
        iVar6 = std::__cxx11::string::compare
                          ((char *)&(pub->data).
                                    super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish[-1].name);
        if (iVar6 == 0) {
          pEVar2 = (pub->data).
                   super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          (pub->data).super__Vector_base<ENF_Data_Base<ENF>,_std::allocator<ENF_Data_Base<ENF>_>_>.
          _M_impl.super__Vector_impl_data._M_finish = pEVar2 + -1;
          pcVar3 = pEVar2[-1].name._M_dataplus._M_p;
          paVar8 = &pEVar2[-1].name.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar8) {
            operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    fclose(__stream);
    Console::Err("Invalid file / failed read/seek: %s -- %i",eodata_safe_fail_filename,0x127);
  }
  exit(1);
}

Assistant:

void read_pub_files(T& pub, const std::string& filename, bool auto_split)
{
	pub.files.clear();
	pub.data.clear();

	std::string filename_template = convert_pub_filename(filename);
	char fn_buf[256];
	int file_number = 1;

	std::snprintf(fn_buf, sizeof fn_buf, filename_template.c_str(), file_number);

	std::FILE *fh = std::fopen(fn_buf, "rb");
	eodata_safe_fail_filename = filename.c_str();

	if (!fh)
	{
		Console::Err("Could not load file: %s", filename.c_str());
		std::exit(1);
	}

	char header_buf[10];
	SAFE_READ(header_buf, sizeof(char), 10, fh);

	std::memcpy(pub.rid.data(), header_buf + 3, 4);
	std::memcpy(pub.len.data(), header_buf + 7, 2);

	int readobj = 0;
	int numobj = PacketProcessor::Number(pub.len[0], pub.len[1]);
	int version = PacketProcessor::Number(header_buf[9]);

	pub.data.resize(numobj + 1);

	while (readobj < numobj && file_number < 1000)
	{
		std::snprintf(fn_buf, sizeof fn_buf, filename_template.c_str(), file_number++);
		pub.files.push_back(Pub_File{fn_buf, {}});
		Pub_File& pub_file = pub.files.back();
		readobj += read_single_file(pub, pub_file, auto_split, version, readobj + 1);

		// Only a single file is loaded if auto-splitting occurs
		if (pub_file.splits.size() > 2)
			break;
	}

	if (version < 1 && pub.data.back().name == "eof")
		pub.data.pop_back();
}